

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modl.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 *in_RSI;
  uint in_EDI;
  FILE *ctx;
  char *output_dir;
  int option_index;
  int option;
  char *in_stack_00003fe8;
  char *in_stack_00003ff0;
  undefined4 local_18;
  int local_14;
  undefined8 *local_10;
  uint local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_14 = -1;
  local_18 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  if ((int)in_EDI < 2) {
    show_options((char **)0x115a8f);
    exit(1);
  }
  while( true ) {
    ctx = (FILE *)(ulong)local_8;
    local_14 = getopt_long(ctx,local_10,":vho:",long_options,&local_18);
    if (local_14 == -1) {
      if (1 < (int)(local_8 - _optind)) {
        ctx = _stderr;
        fprintf(_stderr,
                "%s: Warning several input files specified on command line but only one will be processed\n"
                ,*local_10);
      }
      init((EVP_PKEY_CTX *)ctx);
      finname = (char *)local_10[_optind];
      openfiles(in_stack_00003ff0,in_stack_00003fe8);
      yyparse();
      solvhandler();
      consistency();
      chk_thread_safe();
      parout();
      c_out();
      fclose((FILE *)fcout);
      free_global_variables();
      if (vectorize != 0) {
        fprintf(_stderr,"Thread Safe\n");
      }
      if (usederivstatearray != 0) {
        fprintf(_stderr,
                "Derivatives of STATE array variables are not translated correctly and compile time errors will be generated.\n"
               );
        fprintf(_stderr," %s.c file may be manually edited to fix these errors.\n",modprefix);
      }
      return 0;
    }
    if (local_14 == 0x3a) {
      fprintf(_stderr,"%s: option \'-%c\' requires an argument\n",*local_10,(ulong)_optopt);
      exit(-1);
    }
    if (local_14 == 0x3f) break;
    if (local_14 == 0x68) {
      show_options((char **)0x115b47);
      exit(0);
    }
    if (local_14 != 0x6f) {
      if (local_14 == 0x76) {
        printf("%s\n",nmodl_version_);
        exit(0);
      }
      break;
    }
    strdup(_optarg);
  }
  fprintf(_stderr,"%s: invalid option `-%c\' \n",*local_10,(ulong)_optopt);
  exit(-1);
}

Assistant:

int main(int argc, char** argv) {
  int option        = -1;
  int option_index  = 0;
  char* output_dir = NULL;

  if (argc < 2) {
    show_options(argv);
    exit(1);
  }

  while ( (option = getopt_long (argc, argv, ":vho:", long_options, &option_index)) != -1) {
    switch (option) {
      case 'v':
        printf("%s\n", nmodl_version_);
        exit(0);

      case 'o':
        output_dir = strdup(optarg);
        break;

      case 'h':
        show_options(argv);
        exit(0);

      case ':':
        fprintf(stderr, "%s: option '-%c' requires an argument\n", argv[0], optopt);
        exit (-1);

      case '?':
      default:
        fprintf(stderr, "%s: invalid option `-%c' \n", argv[0], optopt);
        exit (-1);
    }
  }
  if ((argc - optind) > 1) {
    fprintf(stderr, "%s: Warning several input files specified on command line but only one will be processed\n", argv[0]);
  }

  init(); /* keywords into symbol table, initialize lists, etc. */
  finname = argv[optind];
  openfiles(finname, output_dir); /* .mrg else .mod,  .var, .c */
  IGNORE(yyparse());
/*
 * At this point all blocks are fully processed except the kinetic
 * block and the solve statements. Even in these cases the 
 * processing doesn't involve syntax since the information is
 * held in intermediate lists of specific structure.
 *
 */
/*
 * go through the list of solve statements and construct the model()
 * code 
 */
  solvhandler();
/* 
 * NAME's can be used in many cases before they were declared and
 * no checking up to this point has been done to make sure that
 * names have been used in only one way.
 *
 */
  consistency();
  chk_thread_safe();
  parout();
  c_out();   /* print .c file */

  IGNORE(fclose(fcout));

  free_global_variables();

#if NMODL && VECTORIZE
  if (vectorize) {
    Fprintf(stderr, "Thread Safe\n");
  }
  if (usederivstatearray) {
    fprintf(stderr, "Derivatives of STATE array variables are not translated correctly and compile time errors will be generated.\n");
    fprintf(stderr, " %s.c file may be manually edited to fix these errors.\n", modprefix);
  }
#endif

#if LINT
{ /* for lex */
  extern int      yytchar, yylineno;
  extern FILE    *yyin;
  IGNORE(yyin);
  IGNORE(yytchar);
  IGNORE(yylineno);
  IGNORE(yyinput());
  yyunput(ilint);
  yyoutput(ilint);
}
#endif
  return 0;
}